

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_compact.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::CompactData::CompactDataSink::put
          (CompactDataSink *this,char *key,ResourceValue *value,UBool param_3,UErrorCode *status)

{
  CompactData *pCVar1;
  UErrorCode *pUVar2;
  UErrorCode *pUVar3;
  UBool UVar4;
  char cVar5;
  int32_t iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  long lVar11;
  byte bVar12;
  uint uVar13;
  char16_t *s1;
  int iVar14;
  int32_t patternLength;
  ResourceTable powersOfTenTable;
  ResourceTable pluralVariantsTable;
  char *local_c8;
  int local_c0;
  int local_bc;
  UErrorCode *local_b8;
  int local_ac;
  ulong local_a8;
  undefined8 local_a0;
  CompactDataSink *local_98;
  long local_90;
  ResourceValue *local_88;
  ResourceTable local_80;
  ResourceTable local_58;
  
  local_c8 = key;
  (*(value->super_UObject)._vptr_UObject[0xb])
            (&local_80,value,status,CONCAT71(in_register_00000009,param_3));
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
     (local_b8 = status, UVar4 = ResourceTable::getKeyAndValue(&local_80,0,&local_c8,value),
     UVar4 != '\0')) {
    iVar14 = 0;
    local_98 = this;
    local_88 = value;
    while( true ) {
      local_c0 = iVar14;
      sVar10 = strlen(local_c8);
      pUVar2 = local_b8;
      cVar5 = (char)sVar10 + -1;
      local_a0 = CONCAT71((int7)(sVar10 >> 8),cVar5);
      local_90 = (long)cVar5;
      bVar12 = this->data->multipliers[local_90];
      uVar9 = (uint)bVar12;
      (*(value->super_UObject)._vptr_UObject[0xb])(&local_58,value,local_b8);
      if (U_ZERO_ERROR < *pUVar2) break;
      UVar4 = ResourceTable::getKeyAndValue(&local_58,0,&local_c8,value);
      if (UVar4 != '\0') {
        local_ac = (char)local_a0 * 6;
        local_a8 = (ulong)(uint)~(int)(char)local_a0;
        iVar14 = 0;
        do {
          pUVar2 = local_b8;
          iVar6 = StandardPlural::indexFromString(local_c8,local_b8);
          pUVar3 = local_b8;
          if (U_ZERO_ERROR < *pUVar2) {
            return;
          }
          iVar7 = iVar6 + local_ac;
          if (this->data->patterns[iVar7] == (UChar *)0x0) {
            iVar8 = (*(value->super_UObject)._vptr_UObject[4])(value,&local_bc,local_b8);
            s1 = (char16_t *)CONCAT44(extraout_var,iVar8);
            if (U_ZERO_ERROR < *pUVar3) {
              return;
            }
            iVar6 = u_strcmp_63(s1,L"0");
            if (iVar6 == 0) {
              local_bc = 0;
              s1 = L"<USE FALLBACK>";
            }
            local_98->data->patterns[iVar7] = s1;
            this = local_98;
            value = local_88;
            if ((char)uVar9 == '\0') {
              uVar13 = 0;
              uVar9 = uVar13;
              if (0 < (long)local_bc) {
                lVar11 = 0;
                do {
                  if (s1[lVar11] == L'0') {
                    uVar13 = uVar13 + 1;
                  }
                  else if (0 < (int)uVar13) {
                    uVar9 = uVar13 + (int)local_a8;
                    goto LAB_00277767;
                  }
                  lVar11 = lVar11 + 1;
                } while (local_bc != lVar11);
                uVar9 = uVar13 + (int)local_a8;
                if ((int)uVar13 < 1) {
                  uVar9 = 0;
                }
              }
            }
          }
LAB_00277767:
          bVar12 = (byte)uVar9;
          iVar14 = iVar14 + 1;
          UVar4 = ResourceTable::getKeyAndValue(&local_58,iVar14,&local_c8,value);
        } while (UVar4 != '\0');
      }
      if (this->data->multipliers[local_90] == '\0') {
        this->data->multipliers[local_90] = bVar12;
        pCVar1 = this->data;
        if (pCVar1->largestMagnitude < (char)local_a0) {
          pCVar1->largestMagnitude = (char)local_a0;
        }
        pCVar1->isEmpty = '\0';
      }
      iVar14 = local_c0 + 1;
      UVar4 = ResourceTable::getKeyAndValue(&local_80,iVar14,&local_c8,value);
      if (UVar4 == '\0') {
        return;
      }
    }
  }
  return;
}

Assistant:

void CompactData::CompactDataSink::put(const char *key, ResourceValue &value, UBool /*noFallback*/,
                                       UErrorCode &status) {
    // traverse into the table of powers of ten
    ResourceTable powersOfTenTable = value.getTable(status);
    if (U_FAILURE(status)) { return; }
    for (int i3 = 0; powersOfTenTable.getKeyAndValue(i3, key, value); ++i3) {

        // Assumes that the keys are always of the form "10000" where the magnitude is the
        // length of the key minus one.  We expect magnitudes to be less than MAX_DIGITS.
        auto magnitude = static_cast<int8_t> (strlen(key) - 1);
        int8_t multiplier = data.multipliers[magnitude];
        U_ASSERT(magnitude < COMPACT_MAX_DIGITS);

        // Iterate over the plural variants ("one", "other", etc)
        ResourceTable pluralVariantsTable = value.getTable(status);
        if (U_FAILURE(status)) { return; }
        for (int i4 = 0; pluralVariantsTable.getKeyAndValue(i4, key, value); ++i4) {

            // Skip this magnitude/plural if we already have it from a child locale.
            // Note: This also skips USE_FALLBACK entries.
            StandardPlural::Form plural = StandardPlural::fromString(key, status);
            if (U_FAILURE(status)) { return; }
            if (data.patterns[getIndex(magnitude, plural)] != nullptr) {
                continue;
            }

            // The value "0" means that we need to use the default pattern and not fall back
            // to parent locales. Example locale where this is relevant: 'it'.
            int32_t patternLength;
            const UChar *patternString = value.getString(patternLength, status);
            if (U_FAILURE(status)) { return; }
            if (u_strcmp(patternString, u"0") == 0) {
                patternString = USE_FALLBACK;
                patternLength = 0;
            }

            // Save the pattern string. We will parse it lazily.
            data.patterns[getIndex(magnitude, plural)] = patternString;

            // If necessary, compute the multiplier: the difference between the magnitude
            // and the number of zeros in the pattern.
            if (multiplier == 0) {
                int32_t numZeros = countZeros(patternString, patternLength);
                if (numZeros > 0) { // numZeros==0 in certain cases, like Somali "Kun"
                    multiplier = static_cast<int8_t> (numZeros - magnitude - 1);
                }
            }
        }

        // Save the multiplier.
        if (data.multipliers[magnitude] == 0) {
            data.multipliers[magnitude] = multiplier;
            if (magnitude > data.largestMagnitude) {
                data.largestMagnitude = magnitude;
            }
            data.isEmpty = false;
        } else {
            U_ASSERT(data.multipliers[magnitude] == multiplier);
        }
    }
}